

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv1_cm_gears.c
# Opt level: O0

gears_t_conflict * glesv1_cm_gears_init(int win_width,int win_height)

{
  int iVar1;
  void *pvVar2;
  _func_void_GLenum_GLuint *p_Var3;
  _func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *p_Var4;
  _func_void_GLbitfield *p_Var5;
  _func_void_GLfloat_GLfloat_GLfloat_GLfloat *p_Var6;
  _func_void_GLenum *p_Var7;
  _func_void_GLsizei_GLuint_ptr *p_Var8;
  _func_void_GLenum_GLint_GLsizei *p_Var9;
  _func_void_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat *p_Var10;
  _func_GLenum_varargs *p_Var11;
  _func_GLubyte_ptr_GLenum *p_Var12;
  _func_void_GLenum_GLenum_GLfloat_ptr *p_Var13;
  _func_void_varargs *p_Var14;
  _func_void_GLenum_GLsizei_GLvoid_ptr *p_Var15;
  _func_void_GLint_GLenum_GLsizei_GLvoid_ptr *p_Var16;
  _func_void_GLenum_GLenum_GLint *p_Var17;
  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr *p_Var18;
  _func_void_GLfloat_GLfloat_GLfloat *p_Var19;
  _func_void_GLint_GLint_GLsizei_GLsizei *p_Var20;
  char *pcVar21;
  uchar *image_data;
  float zFar;
  float zNear;
  void *texture_data;
  int texture_height;
  int texture_width;
  gears_t_conflict *gears;
  int win_height_local;
  int win_width_local;
  
  _texture_height = (gears_t_conflict *)0x0;
  gears._0_4_ = win_height;
  gears._4_4_ = win_width;
  _texture_height = (gears_t_conflict *)calloc(1,0x108);
  if (_texture_height == (gears_t_conflict *)0x0) {
    printf("calloc gears failed\n");
  }
  else {
    pvVar2 = (void *)dlopen("libGL.so.1",1);
    _texture_height->lib_handle = pvVar2;
    if (_texture_height->lib_handle == (void *)0x0) {
      printf("%s library not found\n","libGL.so.1");
    }
    else {
      p_Var3 = (_func_void_GLenum_GLuint *)dlsym(_texture_height->lib_handle,"glBindBuffer");
      _texture_height->glBindBuffer = p_Var3;
      if (_texture_height->glBindBuffer == (_func_void_GLenum_GLuint *)0x0) {
        printf("%s not found\n","glBindBuffer");
      }
      else {
        p_Var4 = (_func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)
                 dlsym(_texture_height->lib_handle,"glBufferData");
        _texture_height->glBufferData = p_Var4;
        if (_texture_height->glBufferData == (_func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)0x0)
        {
          printf("%s not found\n","glBufferData");
        }
        else {
          p_Var5 = (_func_void_GLbitfield *)dlsym(_texture_height->lib_handle,"glClear");
          _texture_height->glClear = p_Var5;
          if (_texture_height->glClear == (_func_void_GLbitfield *)0x0) {
            printf("%s not found\n","glClear");
          }
          else {
            p_Var6 = (_func_void_GLfloat_GLfloat_GLfloat_GLfloat *)
                     dlsym(_texture_height->lib_handle,"glClearColor");
            _texture_height->glClearColor = p_Var6;
            if (_texture_height->glClearColor == (_func_void_GLfloat_GLfloat_GLfloat_GLfloat *)0x0)
            {
              printf("%s not found\n","glClearColor");
            }
            else {
              p_Var7 = (_func_void_GLenum *)dlsym(_texture_height->lib_handle,"glDisable");
              _texture_height->glDisable = p_Var7;
              if (_texture_height->glDisable == (_func_void_GLenum *)0x0) {
                printf("%s not found\n","glDisable");
              }
              else {
                p_Var7 = (_func_void_GLenum *)
                         dlsym(_texture_height->lib_handle,"glDisableClientState");
                _texture_height->glDisableClientState = p_Var7;
                if (_texture_height->glDisableClientState == (_func_void_GLenum *)0x0) {
                  printf("%s not found\n","glDisableClientState");
                }
                else {
                  p_Var8 = (_func_void_GLsizei_GLuint_ptr *)
                           dlsym(_texture_height->lib_handle,"glDeleteBuffers");
                  _texture_height->glDeleteBuffers = p_Var8;
                  if (_texture_height->glDeleteBuffers == (_func_void_GLsizei_GLuint_ptr *)0x0) {
                    printf("%s not found\n","glDeleteBuffers");
                  }
                  else {
                    p_Var9 = (_func_void_GLenum_GLint_GLsizei *)
                             dlsym(_texture_height->lib_handle,"glDrawArrays");
                    _texture_height->glDrawArrays = p_Var9;
                    if (_texture_height->glDrawArrays == (_func_void_GLenum_GLint_GLsizei *)0x0) {
                      printf("%s not found\n","glDrawArrays");
                    }
                    else {
                      p_Var7 = (_func_void_GLenum *)dlsym(_texture_height->lib_handle,"glEnable");
                      _texture_height->glEnable = p_Var7;
                      if (_texture_height->glEnable == (_func_void_GLenum *)0x0) {
                        printf("%s not found\n","glEnable");
                      }
                      else {
                        p_Var7 = (_func_void_GLenum *)
                                 dlsym(_texture_height->lib_handle,"glEnableClientState");
                        _texture_height->glEnableClientState = p_Var7;
                        if (_texture_height->glEnableClientState == (_func_void_GLenum *)0x0) {
                          printf("%s not found\n","glEnableClientState");
                        }
                        else {
                          p_Var10 = (_func_void_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat *)
                                    dlsym(_texture_height->lib_handle,"glFrustumf");
                          _texture_height->glFrustumf = p_Var10;
                          if (_texture_height->glFrustumf ==
                              (_func_void_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat *)0x0) {
                            printf("%s not found\n","glFrustumf");
                          }
                          else {
                            p_Var8 = (_func_void_GLsizei_GLuint_ptr *)
                                     dlsym(_texture_height->lib_handle,"glGenBuffers");
                            _texture_height->glGenBuffers = p_Var8;
                            if (_texture_height->glGenBuffers ==
                                (_func_void_GLsizei_GLuint_ptr *)0x0) {
                              printf("%s not found\n","glGenBuffers");
                            }
                            else {
                              p_Var11 = (_func_GLenum_varargs *)
                                        dlsym(_texture_height->lib_handle,"glGetError");
                              _texture_height->glGetError = p_Var11;
                              if (_texture_height->glGetError == (_func_GLenum_varargs *)0x0) {
                                printf("%s not found\n","glGetError");
                              }
                              else {
                                p_Var12 = (_func_GLubyte_ptr_GLenum *)
                                          dlsym(_texture_height->lib_handle,"glGetString");
                                _texture_height->glGetString = p_Var12;
                                if (_texture_height->glGetString == (_func_GLubyte_ptr_GLenum *)0x0)
                                {
                                  printf("%s not found\n","glGetString");
                                }
                                else {
                                  p_Var13 = (_func_void_GLenum_GLenum_GLfloat_ptr *)
                                            dlsym(_texture_height->lib_handle,"glLightfv");
                                  _texture_height->glLightfv = p_Var13;
                                  if (_texture_height->glLightfv ==
                                      (_func_void_GLenum_GLenum_GLfloat_ptr *)0x0) {
                                    printf("%s not found\n","glLightfv");
                                  }
                                  else {
                                    p_Var14 = (_func_void_varargs *)
                                              dlsym(_texture_height->lib_handle,"glLoadIdentity");
                                    _texture_height->glLoadIdentity = p_Var14;
                                    if (_texture_height->glLoadIdentity == (_func_void_varargs *)0x0
                                       ) {
                                      printf("%s not found\n","glLoadIdentity");
                                    }
                                    else {
                                      p_Var13 = (_func_void_GLenum_GLenum_GLfloat_ptr *)
                                                dlsym(_texture_height->lib_handle,"glMaterialfv");
                                      _texture_height->glMaterialfv = p_Var13;
                                      if (_texture_height->glMaterialfv ==
                                          (_func_void_GLenum_GLenum_GLfloat_ptr *)0x0) {
                                        printf("%s not found\n","glMaterialfv");
                                      }
                                      else {
                                        p_Var7 = (_func_void_GLenum *)
                                                 dlsym(_texture_height->lib_handle,"glMatrixMode");
                                        _texture_height->glMatrixMode = p_Var7;
                                        if (_texture_height->glMatrixMode ==
                                            (_func_void_GLenum *)0x0) {
                                          printf("%s not found\n","glMatrixMode");
                                        }
                                        else {
                                          p_Var15 = (_func_void_GLenum_GLsizei_GLvoid_ptr *)
                                                    dlsym(_texture_height->lib_handle,
                                                          "glNormalPointer");
                                          _texture_height->glNormalPointer = p_Var15;
                                          if (_texture_height->glNormalPointer ==
                                              (_func_void_GLenum_GLsizei_GLvoid_ptr *)0x0) {
                                            printf("%s not found\n","glNormalPointer");
                                          }
                                          else {
                                            p_Var14 = (_func_void_varargs *)
                                                      dlsym(_texture_height->lib_handle,
                                                            "glPopMatrix");
                                            _texture_height->glPopMatrix = p_Var14;
                                            if (_texture_height->glPopMatrix ==
                                                (_func_void_varargs *)0x0) {
                                              printf("%s not found\n","glPopMatrix");
                                            }
                                            else {
                                              p_Var14 = (_func_void_varargs *)
                                                        dlsym(_texture_height->lib_handle,
                                                              "glPushMatrix");
                                              _texture_height->glPushMatrix = p_Var14;
                                              if (_texture_height->glPushMatrix ==
                                                  (_func_void_varargs *)0x0) {
                                                printf("%s not found\n","glPushMatrix");
                                              }
                                              else {
                                                p_Var6 = (_func_void_GLfloat_GLfloat_GLfloat_GLfloat
                                                          *)dlsym(_texture_height->lib_handle,
                                                                  "glRotatef");
                                                _texture_height->glRotatef = p_Var6;
                                                if (_texture_height->glRotatef ==
                                                    (_func_void_GLfloat_GLfloat_GLfloat_GLfloat *)
                                                    0x0) {
                                                  printf("%s not found\n","glRotatef");
                                                }
                                                else {
                                                  p_Var16 = (
                                                  _func_void_GLint_GLenum_GLsizei_GLvoid_ptr *)
                                                  dlsym(_texture_height->lib_handle,
                                                        "glTexCoordPointer");
                                                  _texture_height->glTexCoordPointer = p_Var16;
                                                  if (_texture_height->glTexCoordPointer ==
                                                      (_func_void_GLint_GLenum_GLsizei_GLvoid_ptr *)
                                                      0x0) {
                                                    printf("%s not found\n","glTexCoordPointer");
                                                  }
                                                  else {
                                                    p_Var17 = (_func_void_GLenum_GLenum_GLint *)
                                                              dlsym(_texture_height->lib_handle,
                                                                    "glTexEnvi");
                                                    _texture_height->glTexEnvi = p_Var17;
                                                    if (_texture_height->glTexEnvi ==
                                                        (_func_void_GLenum_GLenum_GLint *)0x0) {
                                                      printf("%s not found\n","glTexEnvi");
                                                    }
                                                    else {
                                                      p_Var18 = (
                                                  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr
                                                  *)dlsym(_texture_height->lib_handle,"glTexImage2D"
                                                         );
                                                  _texture_height->glTexImage2D = p_Var18;
                                                  if (_texture_height->glTexImage2D ==
                                                      (
                                                  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr
                                                  *)0x0) {
                                                    printf("%s not found\n","glTexImage2D");
                                                  }
                                                  else {
                                                    p_Var17 = (_func_void_GLenum_GLenum_GLint *)
                                                              dlsym(_texture_height->lib_handle,
                                                                    "glTexParameteri");
                                                    _texture_height->glTexParameteri = p_Var17;
                                                    if (_texture_height->glTexParameteri ==
                                                        (_func_void_GLenum_GLenum_GLint *)0x0) {
                                                      printf("%s not found\n","glTexParameteri");
                                                    }
                                                    else {
                                                      p_Var19 = (_func_void_GLfloat_GLfloat_GLfloat
                                                                 *)dlsym(_texture_height->lib_handle
                                                                         ,"glTranslatef");
                                                      _texture_height->glTranslatef = p_Var19;
                                                      if (_texture_height->glTranslatef ==
                                                          (_func_void_GLfloat_GLfloat_GLfloat *)0x0)
                                                      {
                                                        printf("%s not found\n","glTranslatef");
                                                      }
                                                      else {
                                                        p_Var16 = (
                                                  _func_void_GLint_GLenum_GLsizei_GLvoid_ptr *)
                                                  dlsym(_texture_height->lib_handle,
                                                        "glVertexPointer");
                                                  _texture_height->glVertexPointer = p_Var16;
                                                  if (_texture_height->glVertexPointer ==
                                                      (_func_void_GLint_GLenum_GLsizei_GLvoid_ptr *)
                                                      0x0) {
                                                    printf("%s not found\n","glVertexPointer");
                                                  }
                                                  else {
                                                    p_Var20 = (
                                                  _func_void_GLint_GLint_GLsizei_GLsizei *)
                                                  dlsym(_texture_height->lib_handle,"glViewport");
                                                  _texture_height->glViewport = p_Var20;
                                                  if (_texture_height->glViewport ==
                                                      (_func_void_GLint_GLint_GLsizei_GLsizei *)0x0)
                                                  {
                                                    printf("%s not found\n","glViewport");
                                                  }
                                                  else {
                                                    (*_texture_height->glEnable)(0xb71);
                                                    (*_texture_height->glEnable)(0xba1);
                                                    (*_texture_height->glEnable)(0xb50);
                                                    (*_texture_height->glEnable)(0x4000);
                                                    pcVar21 = getenv("TEXTURE");
                                                    image_load(pcVar21,(uchar *)0x0,
                                                               (int *)((long)&texture_data + 4),
                                                               (int *)&texture_data);
                                                    image_data = (uchar *)malloc((long)(texture_data
                                                                                        ._4_4_ * (
                                                  int)texture_data * 4));
                                                  if (image_data == (uchar *)0x0) {
                                                    printf("malloc texture_data failed\n");
                                                  }
                                                  else {
                                                    pcVar21 = getenv("TEXTURE");
                                                    image_load(pcVar21,image_data,
                                                               (int *)((long)&texture_data + 4),
                                                               (int *)&texture_data);
                                                    (*_texture_height->glTexImage2D)
                                                              (0xde1,0,0x1908,texture_data._4_4_,
                                                               (int)texture_data,0,0x1908,0x1401,
                                                               image_data);
                                                    free(image_data);
                                                    (*_texture_height->glTexParameteri)
                                                              (0xde1,0x2801,0x2601);
                                                    (*_texture_height->glTexParameteri)
                                                              (0xde1,0x2800,0x2601);
                                                    (*_texture_height->glTexEnvi)
                                                              (0x2300,0x2200,0x2101);
                                                    (*_texture_height->glClearColor)
                                                              (0.0,0.0,0.0,1.0);
                                                    (*_texture_height->glViewport)
                                                              (0,0,gears._4_4_,(int)gears);
                                                    iVar1 = create_gear(_texture_height,0,1.0,4.0,
                                                                        1.0,0x14,0.7);
                                                    if (((iVar1 == 0) &&
                                                        (iVar1 = create_gear(_texture_height,1,0.5,
                                                                             2.0,2.0,10,0.7),
                                                        iVar1 == 0)) &&
                                                       (iVar1 = create_gear(_texture_height,2,1.3,
                                                                            2.0,0.5,10,0.7),
                                                       iVar1 == 0)) {
                                                      (*_texture_height->glMatrixMode)(0x1701);
                                                      (*_texture_height->glFrustumf)
                                                                (-1.0,1.0,-(float)(int)gears /
                                                                          (float)gears._4_4_,
                                                                 (float)(int)gears /
                                                                 (float)gears._4_4_,5.0,60.0);
                                                      (*_texture_height->glMatrixMode)(0x1700);
                                                      return _texture_height;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    glesv1_cm_gears_term(_texture_height);
  }
  return (gears_t_conflict *)0x0;
}

Assistant:

static gears_t *glesv1_cm_gears_init(int win_width, int win_height)
{
  gears_t *gears = NULL;
  int texture_width, texture_height;
  void *texture_data = NULL;
  const float zNear = 5, zFar = 60;

  gears = calloc(1, sizeof(gears_t));
  if (!gears) {
    printf("calloc gears failed\n");
    return NULL;
  }

  gears->lib_handle = dlopen(GLESV1_CM_LIB, RTLD_LAZY);
  if (!gears->lib_handle) {
    printf("%s library not found\n", GLESV1_CM_LIB);
    goto out;
  }

  #define DLSYM(sym) gears->sym = dlsym(gears->lib_handle, #sym); \
  if (!gears->sym) { \
    printf("%s not found\n", #sym); \
    goto out; \
  }

  DLSYM(glBindBuffer);
  DLSYM(glBufferData);
  DLSYM(glClear);
  DLSYM(glClearColor);
  DLSYM(glDisable);
  DLSYM(glDisableClientState);
  DLSYM(glDeleteBuffers);
  DLSYM(glDrawArrays);
  DLSYM(glEnable);
  DLSYM(glEnableClientState);
  DLSYM(glFrustumf);
  DLSYM(glGenBuffers);
  DLSYM(glGetError);
  DLSYM(glGetString);
  DLSYM(glLightfv);
  DLSYM(glLoadIdentity);
  DLSYM(glMaterialfv);
  DLSYM(glMatrixMode);
  DLSYM(glNormalPointer);
  DLSYM(glPopMatrix);
  DLSYM(glPushMatrix);
  DLSYM(glRotatef);
  DLSYM(glTexCoordPointer);
  DLSYM(glTexEnvi);
  DLSYM(glTexImage2D);
  DLSYM(glTexParameteri);
  DLSYM(glTranslatef);
  DLSYM(glVertexPointer);
  DLSYM(glViewport);

  gears->glEnable(GL_DEPTH_TEST);
  gears->glEnable(GL_NORMALIZE);
  gears->glEnable(GL_LIGHTING);
  gears->glEnable(GL_LIGHT0);

  /* load texture */

  image_load(getenv("TEXTURE"), NULL, &texture_width, &texture_height);

  texture_data = malloc(texture_width * texture_height * 4);
  if (!texture_data) {
    printf("malloc texture_data failed\n");
    goto out;
  }

  image_load(getenv("TEXTURE"), texture_data, &texture_width, &texture_height);

  gears->glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, texture_width, texture_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, texture_data);

  free(texture_data);

  gears->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  gears->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
  gears->glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_DECAL);

  /* set clear values, set viewport */

  gears->glClearColor(0, 0, 0, 1);

  gears->glViewport(0, 0, win_width, win_height);

  /* create gears */

  if (create_gear(gears, GEAR0, 1.0, 4.0, 1.0, 20, 0.7)) {
    goto out;
  }

  if (create_gear(gears, GEAR1, 0.5, 2.0, 2.0, 10, 0.7)) {
    goto out;
  }

  if (create_gear(gears, GEAR2, 1.3, 2.0, 0.5, 10, 0.7)) {
    goto out;
  }

  gears->glMatrixMode(GL_PROJECTION);

  gears->glFrustumf(-1, 1, -(float)win_height/win_width, (float)win_height/win_width, zNear, zFar);

  gears->glMatrixMode(GL_MODELVIEW);

  return gears;

out:
  glesv1_cm_gears_term(gears);
  return NULL;
}